

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_vdpu34x.c
# Opt level: O2

MPP_RET hal_vp9d_vdpu34x_start(void *hal,HalTaskInfo *task)

{
  long lVar1;
  MppDev ctx;
  void *pvVar2;
  MPP_RET MVar3;
  long *plVar4;
  char *fmt;
  MppDevRegWrCfg wr_cfg;
  MppDevRegRdCfg rd_cfg;
  
  lVar1 = *(long *)((long)hal + 0x40);
  if (*(int *)((long)hal + 0x38) == 0) {
    plVar4 = (long *)(lVar1 + 0xe8);
  }
  else {
    plVar4 = (long *)((long)(task->dec).reg_index * 0x40 + lVar1 + 0x30);
  }
  ctx = *(MppDev *)((long)hal + 0x10);
  pvVar2 = (void *)*plVar4;
  if ((pvVar2 == (void *)0x0) &&
     (_mpp_log_l(2,"hal_vp9d_vdpu34x","Assertion %s failed at %s:%d\n",(char *)0x0,"hw_regs",
                 "hal_vp9d_vdpu34x_start",0x361), (mpp_debug._3_1_ & 0x10) != 0)) {
    abort();
  }
  wr_cfg.size = 100;
  wr_cfg.offset = 0x20;
  wr_cfg.reg = pvVar2;
  MVar3 = mpp_dev_ioctl(ctx,4,&wr_cfg);
  if (MVar3 == MPP_OK) {
    wr_cfg.reg = (void *)((long)pvVar2 + 100);
    wr_cfg.size = 0xc4;
    wr_cfg.offset = 0x100;
    MVar3 = mpp_dev_ioctl(ctx,4,&wr_cfg);
    if (MVar3 == MPP_OK) {
      wr_cfg.reg = (void *)((long)pvVar2 + 0x128);
      wr_cfg.size = 0x3c;
      wr_cfg.offset = 0x200;
      MVar3 = mpp_dev_ioctl(ctx,4,&wr_cfg);
      if (MVar3 == MPP_OK) {
        wr_cfg.reg = (void *)((long)pvVar2 + 0x164);
        wr_cfg.size = 0x98;
        wr_cfg.offset = 0x280;
        MVar3 = mpp_dev_ioctl(ctx,4,&wr_cfg);
        if (MVar3 == MPP_OK) {
          wr_cfg.reg = (void *)((long)pvVar2 + 0x234);
          wr_cfg.size = 0x58;
          wr_cfg.offset = 0x400;
          MVar3 = mpp_dev_ioctl(ctx,4,&wr_cfg);
          if (MVar3 == MPP_OK) {
            rd_cfg.reg = (void *)((long)pvVar2 + 0x1fc);
            rd_cfg.size = 0x38;
            rd_cfg.offset = 0x380;
            MVar3 = mpp_dev_ioctl(ctx,5,&rd_cfg);
            if (MVar3 == MPP_OK) {
              vdpu34x_set_rcbinfo(ctx,(Vdpu34xRcbInfo *)(lVar1 + 0x16c));
              MVar3 = mpp_dev_ioctl(ctx,0xf,(void *)0x0);
              if (MVar3 == MPP_OK) {
                return MPP_OK;
              }
              _mpp_log_l(2,"hal_vp9d_vdpu34x","send cmd failed %d\n","hal_vp9d_vdpu34x_start",
                         (ulong)(uint)MVar3);
              return MVar3;
            }
            fmt = "set register read failed %d\n";
            goto LAB_001f9cbc;
          }
        }
      }
    }
  }
  fmt = "set register write failed %d\n";
LAB_001f9cbc:
  _mpp_log_l(2,"hal_vp9d_vdpu34x",fmt,"hal_vp9d_vdpu34x_start",(ulong)(uint)MVar3);
  return MVar3;
}

Assistant:

static MPP_RET hal_vp9d_vdpu34x_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    HalVp9dCtx *p_hal = (HalVp9dCtx*)hal;
    Vdpu34xVp9dCtx *hw_ctx = (Vdpu34xVp9dCtx*)p_hal->hw_ctx;
    Vdpu34xVp9dRegSet *hw_regs = (Vdpu34xVp9dRegSet *)hw_ctx->hw_regs;
    MppDev dev = p_hal->dev;

    if (p_hal->fast_mode) {
        RK_S32 index =  task->dec.reg_index;
        hw_regs = (Vdpu34xVp9dRegSet *)hw_ctx->g_buf[index].hw_regs;
    }

    mpp_assert(hw_regs);


#if VP9_DUMP
    {
        static RK_U32 file_cnt = 0;
        char file_name[128];
        sprintf(file_name, "/data/vp9_regs/reg_%d.txt", file_cnt);
        FILE *fp = fopen(file_name, "wb");
        RK_U32 i = 0;
        RK_U32 *tmp = NULL;
        tmp = (RK_U32 *)&hw_regs->common;
        for (i = 0; i < sizeof(hw_regs->common) / 4; i++) {
            fprintf(fp, "reg[%d] 0x%08x\n", i + 8, tmp[i]);
        }
        fprintf(fp, "\n");
        tmp = (RK_U32 *)&hw_regs->vp9d_param;
        for (i = 0; i < sizeof(hw_regs->vp9d_param) / 4; i++) {
            fprintf(fp, "reg[%d] 0x%08x\n", i + 64, tmp[i]);
        }
        fprintf(fp, "\n");
        tmp = (RK_U32 *)&hw_regs->common_addr;
        for (i = 0; i < sizeof(hw_regs->common_addr) / 4; i++) {
            fprintf(fp, "reg[%d] 0x%08x\n", i + 128, tmp[i]);
        }
        fprintf(fp, "\n");
        tmp = (RK_U32 *)&hw_regs->vp9d_addr;
        for (i = 0; i < sizeof(hw_regs->vp9d_addr) / 4; i++) {
            fprintf(fp, "reg[%d] 0x%08x\n", i + 160, tmp[i]);
        }
        file_cnt++;
        fflush(fp);
        fclose(fp);
    }
#endif

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        wr_cfg.reg = &hw_regs->common;
        wr_cfg.size = sizeof(hw_regs->common);
        wr_cfg.offset = OFFSET_COMMON_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &hw_regs->vp9d_param;
        wr_cfg.size = sizeof(hw_regs->vp9d_param);
        wr_cfg.offset = OFFSET_CODEC_PARAMS_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &hw_regs->common_addr;
        wr_cfg.size = sizeof(hw_regs->common_addr);
        wr_cfg.offset = OFFSET_COMMON_ADDR_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &hw_regs->vp9d_addr;
        wr_cfg.size = sizeof(hw_regs->vp9d_addr);
        wr_cfg.offset = OFFSET_CODEC_ADDR_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &hw_regs->statistic;
        wr_cfg.size = sizeof(hw_regs->statistic);
        wr_cfg.offset = OFFSET_STATISTIC_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &hw_regs->irq_status;
        rd_cfg.size = sizeof(hw_regs->irq_status);
        rd_cfg.offset = OFFSET_INTERRUPT_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        /* rcb info for sram */
        vdpu34x_set_rcbinfo(dev, hw_ctx->rcb_info);

        ret = mpp_dev_ioctl(dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    (void)task;
    return ret;
}